

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

int __thiscall
gl4cts::UncommittedRegionsAccessTestCase::init
          (UncommittedRegionsAccessTestCase *this,EVP_PKEY_CTX *ctx)

{
  reference pvVar1;
  vector<int,_std::allocator<int>_> *this_00;
  int local_10 [2];
  
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             mSupportedTargets;
  local_10[1] = 0x9100;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,local_10 + 1);
  local_10[0] = 0x9102;
  pvVar1 = std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,local_10);
  return (int)pvVar1;
}

Assistant:

void UncommittedRegionsAccessTestCase::init()
{
	SparseTextureCommitmentTestCase::init();

	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
}